

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

bool __thiscall QResourceFileEngine::seek(QResourceFileEngine *this,qint64 pos)

{
  bool bVar1;
  QResourceFileEnginePrivate *pQVar2;
  long lVar3;
  qint64 in_RSI;
  long *in_RDI;
  QResourceFileEnginePrivate *d;
  QResource *in_stack_ffffffffffffffd0;
  qint64 qVar4;
  bool local_1;
  
  pQVar2 = d_func((QResourceFileEngine *)0x2ea011);
  bVar1 = QResource::isValid(in_stack_ffffffffffffffd0);
  if (bVar1) {
    qVar4 = pQVar2->offset;
    lVar3 = (**(code **)(*in_RDI + 0x30))();
    if (lVar3 < qVar4) {
      local_1 = false;
    }
    else {
      pQVar2->offset = in_RSI;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QResourceFileEngine::seek(qint64 pos)
{
    Q_D(QResourceFileEngine);
    if (!d->resource.isValid())
        return false;

    if (d->offset > size())
        return false;
    d->offset = pos;
    return true;
}